

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Unarchive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *this,MemIOReader *Reader)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *pFVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  byte bVar14;
  value_type tmp_item;
  UL local_50;
  
  uVar10 = (ulong)Reader->m_capacity;
  uVar7 = (ulong)Reader->m_size;
  uVar1 = uVar7 + 4;
  pFVar9 = this;
  if (uVar1 <= uVar10) {
    uVar6 = *(uint *)(Reader->m_p + uVar7);
    pFVar9 = (FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *)
             (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
                    );
    uVar6 = Reader->m_size + 4;
    uVar7 = (ulong)uVar6;
    Reader->m_size = uVar6;
  }
  bVar14 = (byte)uVar7;
  if (uVar10 < uVar1) {
    bVar8 = false;
  }
  else {
    uVar6 = Reader->m_size;
    uVar1 = (ulong)uVar6 + 4;
    if (uVar1 <= uVar10) {
      iVar2 = *(int *)(Reader->m_p + uVar6);
      Reader->m_size = uVar6 + 4;
      bVar14 = iVar2 == 0x10000000;
    }
    uVar6 = (uint)pFVar9;
    bVar8 = false;
    if ((uVar1 <= uVar10) && (bVar8 = false, uVar6 == 0 || (bVar14 & 1) != 0)) {
      if (uVar6 == 0) {
        bVar8 = true;
      }
      else {
        uVar12 = 1;
        do {
          local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
               (_func_int **)&PTR__IArchive_0021f038;
          uVar3 = Reader->m_capacity;
          uVar11 = Reader->m_size + 0x10;
          bVar8 = uVar11 <= uVar3;
          if (uVar3 < uVar11) {
            return bVar8;
          }
          uVar4 = *(undefined8 *)(Reader->m_p + Reader->m_size);
          uVar5 = *(undefined8 *)(Reader->m_p + Reader->m_size + 8);
          local_50.super_Identifier<16U>.m_Value._0_7_ = SUB87(uVar4,0);
          local_50.super_Identifier<16U>.m_Value[7] = (byte_t)((ulong)uVar4 >> 0x38);
          local_50.super_Identifier<16U>.m_Value._8_7_ = SUB87(uVar5,0);
          local_50.super_Identifier<16U>.m_Value[0xf] = (byte_t)((ulong)uVar5 >> 0x38);
          Reader->m_size = uVar11;
          local_50.super_Identifier<16U>.m_HasValue = uVar11 <= uVar3;
          std::
          _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
          ::_M_insert_unique<ASDCP::UL_const&>
                    ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                      *)&(this->super_PushSet<ASDCP::UL>).
                         super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>,
                     &local_50);
          bVar13 = uVar12 < uVar6;
          uVar12 = uVar12 + 1;
        } while (bVar13);
      }
    }
  }
  return bVar8;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }